

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_dm.cxx
# Opt level: O0

bool __thiscall xray_re::xr_dm::load_dm(xr_dm *this,char *path)

{
  bool bVar1;
  xr_reader *local_30;
  xr_reader *r;
  xr_file_system *fs;
  char *path_local;
  xr_dm *this_local;
  
  fs = (xr_file_system *)path;
  path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  local_30 = xr_file_system::r_open((xr_file_system *)r,(char *)fs);
  bVar1 = local_30 != (xr_reader *)0x0;
  if (bVar1) {
    load_dm(this,local_30);
    xr_file_system::r_close((xr_file_system *)r,&local_30);
  }
  return bVar1;
}

Assistant:

bool xr_dm::load_dm(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	load_dm(*r);
	fs.r_close(r);
	return true;
}